

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UChar * res_getAlias_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_3_a62c8074 *local_40;
  int32_t *p32;
  int32_t length;
  uint32_t offset;
  UChar *p;
  int32_t *pLength_local;
  Resource res_local;
  ResourceData *pResData_local;
  
  if (res >> 0x1c == 3) {
    if ((res & 0xfffffff) == 0) {
      local_40 = &gEmptyString;
    }
    else {
      local_40 = (anon_struct_8_3_a62c8074 *)(pResData->pRoot + (res & 0xfffffff));
    }
    _length = &local_40->nul;
    p32._0_4_ = local_40->length;
  }
  else {
    _length = (UChar *)0x0;
    p32._0_4_ = 0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = (int32_t)p32;
  }
  return _length;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
res_getAlias(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const UChar *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_ALIAS) {
        const int32_t *p32= offset==0 ? &gEmptyString.length : pResData->pRoot+offset;
        length=*p32++;
        p=(const UChar *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}